

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O1

int anon_unknown.dwarf_7cded::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  undefined4 in_register_0000003c;
  undefined8 *puVar6;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  puVar6 = (undefined8 *)CONCAT44(in_register_0000003c,__fd);
  iVar1 = nn_socket(1,0x21);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"nn_socket: ",0xb);
    iVar1 = nn_errno();
    pcVar3 = nn_strerror(iVar1);
    std::operator<<(local_190,pcVar3);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1c0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = nn_connect(iVar1,(char *)*puVar6);
  if (-1 < iVar2) {
    iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
    if (-1 < iVar2) {
      return iVar1;
    }
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"nn_setsockopt: ",0xf);
    iVar1 = nn_errno();
    pcVar3 = nn_strerror(iVar1);
    std::operator<<(local_190,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(local_190," (",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)*puVar6,puVar6[1])
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1c0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nn_close(iVar1);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"nn_connect: ",0xc);
  iVar1 = nn_errno();
  pcVar3 = nn_strerror(iVar1);
  std::operator<<(local_190,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(local_190," (",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_1c0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int connect(const std::string& endpoint) {
  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  auto rv = nn_connect(fd, endpoint.c_str());
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  return fd;
}